

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_step(sqlite3_stmt *pStmt)

{
  sqlite3 *db_00;
  bool bVar1;
  int iVar2;
  uchar *z;
  char *pcVar3;
  bool bVar4;
  char *zErr;
  sqlite3 *db;
  int cnt;
  Vdbe *v;
  int rc2;
  int rc;
  sqlite3_stmt *pStmt_local;
  
  v._0_4_ = 0;
  db._4_4_ = 0;
  iVar2 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar2 == 0) {
    db_00 = *(sqlite3 **)pStmt;
    sqlite3_mutex_enter(db_00->mutex);
    *(ushort *)(pStmt + 0x9a) = *(ushort *)(pStmt + 0x9a) & 0xfbff;
    while( true ) {
      v._4_4_ = sqlite3Step((Vdbe *)pStmt);
      bVar4 = false;
      if (v._4_4_ == 0x11) {
        iVar2 = db._4_4_ + 1;
        bVar4 = false;
        bVar1 = db._4_4_ < 0x32;
        db._4_4_ = iVar2;
        if (bVar1) {
          v._0_4_ = sqlite3Reprepare((Vdbe *)pStmt);
          bVar4 = (int)v == 0;
          v._4_4_ = (int)v;
        }
      }
      if (!bVar4) break;
      sqlite3_reset(pStmt);
      *(ushort *)(pStmt + 0x9a) = *(ushort *)(pStmt + 0x9a) & 0xfbff | 0x400;
    }
    if ((((int)v != 0) && ((*(ushort *)(pStmt + 0x9a) >> 9 & 1) != 0)) &&
       (db_00->pErr != (sqlite3_value *)0x0)) {
      z = sqlite3_value_text(db_00->pErr);
      sqlite3DbFree(db_00,*(void **)(pStmt + 0x58));
      if (db_00->mallocFailed == '\0') {
        pcVar3 = sqlite3DbStrDup(db_00,(char *)z);
        *(char **)(pStmt + 0x58) = pcVar3;
        *(int *)(pStmt + 0x94) = (int)v;
      }
      else {
        *(undefined8 *)(pStmt + 0x58) = 0;
        v._4_4_ = 7;
        *(undefined4 *)(pStmt + 0x94) = 7;
      }
    }
    pStmt_local._4_4_ = sqlite3ApiExit(db_00,v._4_4_);
    sqlite3_mutex_leave(db_00->mutex);
  }
  else {
    pStmt_local._4_4_ = sqlite3MisuseError(0xf8b5);
  }
  return pStmt_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY
         && (rc2 = rc = sqlite3Reprepare(v))==SQLITE_OK ){
    sqlite3_reset(pStmt);
    v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK && ALWAYS(v->isPrepareV2) && ALWAYS(db->pErr) ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}